

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O2

void mserialize::detail::visit_arithmetic<binlog::ToStringVisitor,binlog::Range>
               (char tag,ToStringVisitor *visitor,Range *istream)

{
  int iVar1;
  runtime_error *this;
  undefined7 in_register_00000039;
  allocator local_9d;
  uint8_t B;
  int8_t b;
  char c;
  bool y;
  uint16_t S;
  int16_t s;
  float f;
  uint32_t I;
  int32_t i;
  longdouble local_88;
  double d;
  uint64_t L;
  int64_t l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  iVar1 = (int)CONCAT71(in_register_00000039,tag);
  switch(iVar1) {
  case 0x62:
    TrivialDeserializer<signed_char>::deserialize<binlog::Range>(&b,istream);
    binlog::ToStringVisitor::visit(visitor,b);
    break;
  case 99:
    TrivialDeserializer<char>::deserialize<binlog::Range>(&c,istream);
    binlog::ToStringVisitor::visit<char>(visitor,c);
    break;
  case 100:
    TrivialDeserializer<double>::deserialize<binlog::Range>(&d,istream);
    binlog::ToStringVisitor::visit<double>(visitor,d);
    break;
  case 0x65:
  case 0x67:
  case 0x68:
  case 0x6a:
  case 0x6b:
switchD_00159ad6_caseD_65:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string((string *)&local_58,"Invalid arithmetic tag: ",&local_9d);
    std::operator+(&local_38,&local_58,tag);
    std::runtime_error::runtime_error(this,(string *)&local_38);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case 0x66:
    TrivialDeserializer<float>::deserialize<binlog::Range>(&f,istream);
    binlog::ToStringVisitor::visit<float>(visitor,f);
    break;
  case 0x69:
    TrivialDeserializer<int>::deserialize<binlog::Range>(&i,istream);
    binlog::ToStringVisitor::visit<int>(visitor,i);
    break;
  case 0x6c:
    TrivialDeserializer<long>::deserialize<binlog::Range>(&l,istream);
    binlog::ToStringVisitor::visit<long>(visitor,l);
    break;
  default:
    if (iVar1 == 0x42) {
      TrivialDeserializer<unsigned_char>::deserialize<binlog::Range>(&B,istream);
      binlog::ToStringVisitor::visit(visitor,B);
    }
    else if (iVar1 == 0x44) {
      TrivialDeserializer<long_double>::deserialize<binlog::Range>(&local_88,istream);
      binlog::ToStringVisitor::visit<long_double>(visitor,local_88);
    }
    else if (iVar1 == 0x49) {
      TrivialDeserializer<unsigned_int>::deserialize<binlog::Range>(&I,istream);
      binlog::ToStringVisitor::visit<unsigned_int>(visitor,I);
    }
    else if (iVar1 == 0x4c) {
      TrivialDeserializer<unsigned_long>::deserialize<binlog::Range>(&L,istream);
      binlog::ToStringVisitor::visit<unsigned_long>(visitor,L);
    }
    else if (iVar1 == 0x53) {
      TrivialDeserializer<unsigned_short>::deserialize<binlog::Range>(&S,istream);
      binlog::ToStringVisitor::visit<unsigned_short>(visitor,S);
    }
    else if (iVar1 == 0x73) {
      TrivialDeserializer<short>::deserialize<binlog::Range>(&s,istream);
      binlog::ToStringVisitor::visit<short>(visitor,s);
    }
    else {
      if (iVar1 != 0x79) goto switchD_00159ad6_caseD_65;
      TrivialDeserializer<bool>::deserialize<binlog::Range>(&y,istream);
      binlog::ToStringVisitor::visit<bool>(visitor,y);
    }
  }
  return;
}

Assistant:

void visit_arithmetic(char tag, Visitor& visitor, InputStream& istream)
{
  switch(tag)
  {
  case 'y': bool y; mserialize::deserialize(y, istream); visitor.visit(y); break;
  case 'c': char c; mserialize::deserialize(c, istream); visitor.visit(c); break;

  case 'b': std::int8_t  b; mserialize::deserialize(b, istream); visitor.visit(b); break;
  case 's': std::int16_t s; mserialize::deserialize(s, istream); visitor.visit(s); break;
  case 'i': std::int32_t i; mserialize::deserialize(i, istream); visitor.visit(i); break;
  case 'l': std::int64_t l; mserialize::deserialize(l, istream); visitor.visit(l); break;

  case 'B': std::uint8_t  B; mserialize::deserialize(B, istream); visitor.visit(B); break;
  case 'S': std::uint16_t S; mserialize::deserialize(S, istream); visitor.visit(S); break;
  case 'I': std::uint32_t I; mserialize::deserialize(I, istream); visitor.visit(I); break;
  case 'L': std::uint64_t L; mserialize::deserialize(L, istream); visitor.visit(L); break;

  case 'f': float f;       mserialize::deserialize(f, istream); visitor.visit(f); break;
  case 'd': double d;      mserialize::deserialize(d, istream); visitor.visit(d); break;
  case 'D': long double D; mserialize::deserialize(D, istream); visitor.visit(D); break;
  default: throw std::runtime_error(std::string("Invalid arithmetic tag: ") + tag); break;
  }
}